

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgAcceleratedDataStructures.cpp
# Opt level: O0

TypeAcceleration TasGrid::AccelerationMeta::getAvailableFallback(TypeAcceleration accel)

{
  undefined4 local_c;
  TypeAcceleration accel_local;
  
  local_c = accel;
  if (accel == accel_gpu_default) {
    local_c = accel_gpu_magma;
  }
  if (local_c == accel_cpu_blas) {
    local_c = accel_none;
  }
  else if (local_c - accel_gpu_cublas < 2) {
    local_c = accel_none;
  }
  else if (local_c == accel_gpu_magma) {
    local_c = accel_none;
  }
  return local_c;
}

Assistant:

TypeAcceleration AccelerationMeta::getAvailableFallback(TypeAcceleration accel){
    // sparse grids are evaluated in 2 stages:
    // - s1: convert multi-index to matrix B
    // - s2: multiply matrix B by stored matrix A
    // Mode   | Stage 1 device | Stage 2 device | Library for stage 2
    // CUBLAS |      CPU       |     GPU        | Nvidia cuBlas (or cuSparse)
    // CUDA   |      GPU       |     GPU        | Nvidia cuBlas (or cuSparse)
    // MAGMA  |      GPU*      |     GPU        | UTK magma and magma_sparse
    // BLAS   |      CPU       |     CPU        | BLAS
    // none   | all done on CPU, still using OpenMP (if available)
    // note that CUDA, HIP and DPCPP are interchangeable based on the selected backend at compiler time

    #ifdef Tasmanian_ENABLE_DPCPP
    // temporary workaround
//     if (accel == accel_gpu_magma or accel == accel_gpu_cuda)
//         return accel_gpu_cublas;
//     return accel;
    #endif

    // accel_gpu_default should always point to the potentially "best" option (currently MAGMA)
    if (accel == accel_gpu_default) accel = accel_gpu_magma;
    #if !defined(Tasmanian_ENABLE_GPU) || !defined(Tasmanian_ENABLE_MAGMA) || !defined(Tasmanian_ENABLE_BLAS)
    // if any of the 3 acceleration modes is missing, then add a switch statement to guard against setting that mode
    switch(accel){
        #ifndef Tasmanian_ENABLE_GPU
        // if CUDA is missing: just use the CPU
        case accel_gpu_cublas:
        case accel_gpu_cuda:
            #ifdef Tasmanian_ENABLE_BLAS
            accel = accel_cpu_blas;
            #else
            accel = accel_none;
            #endif
            break;
        #endif // Tasmanian_ENABLE_GPU
        #ifndef Tasmanian_ENABLE_MAGMA
        // MAGMA tries to use CUDA kernels with magma linear algebra, this CUDA is the next best thing
        case accel_gpu_magma:
            #ifdef Tasmanian_ENABLE_GPU
            accel = accel_gpu_cuda;
            #elif defined(Tasmanian_ENABLE_BLAS)
            accel = accel_cpu_blas;
            #else
            accel = accel_none;
            #endif
            break;
        #endif // Tasmanian_ENABLE_MAGMA
        #ifndef Tasmanian_ENABLE_BLAS
        // if BLAS is missing, do not attempt to use the GPU but go directly to "none" mode
        case accel_cpu_blas:
            accel = accel_none;
            break;
        #endif // Tasmanian_ENABLE_BLAS
        default: // compiler complains if there is no explicit "default", even if empty
            break;
    }
    #endif
    return accel;
}